

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_vector_generated.h
# Opt level: O0

Offset<void> __thiscall
CharacterUnion::Pack(CharacterUnion *this,FlatBufferBuilder *_fbb,rehasher_function_t *_rehasher)

{
  Offset<flatbuffers::String> local_84;
  string *local_80;
  string *ptr_5;
  string *local_70;
  string *ptr_4;
  BookReader *local_60;
  BookReader *ptr_3;
  BookReader *local_50;
  BookReader *ptr_2;
  Rapunzel *local_40;
  Rapunzel *ptr_1;
  AttackerT *local_30;
  AttackerT *ptr;
  rehasher_function_t *_rehasher_local;
  FlatBufferBuilder *_fbb_local;
  CharacterUnion *this_local;
  
  ptr = (AttackerT *)_rehasher;
  _rehasher_local = (rehasher_function_t *)_fbb;
  _fbb_local = (FlatBufferBuilder *)this;
  switch(this->type) {
  case Character_MuLan:
    local_30 = (AttackerT *)this->value;
    ptr_1._4_4_ = CreateAttacker(_fbb,local_30,_rehasher);
    this_local._4_4_ = flatbuffers::Offset<Attacker>::Union((Offset<Attacker> *)((long)&ptr_1 + 4));
    break;
  case Character_Rapunzel:
    local_40 = (Rapunzel *)this->value;
    ptr_2._4_4_ = flatbuffers::FlatBufferBuilderImpl<false>::CreateStruct<Rapunzel>(_fbb,local_40);
    this_local._4_4_ =
         flatbuffers::Offset<const_Rapunzel_*>::Union
                   ((Offset<const_Rapunzel_*> *)((long)&ptr_2 + 4));
    break;
  case Character_Belle:
    local_50 = (BookReader *)this->value;
    ptr_3._4_4_ = flatbuffers::FlatBufferBuilderImpl<false>::CreateStruct<BookReader>(_fbb,local_50)
    ;
    this_local._4_4_ =
         flatbuffers::Offset<const_BookReader_*>::Union
                   ((Offset<const_BookReader_*> *)((long)&ptr_3 + 4));
    break;
  case Character_BookFan:
    local_60 = (BookReader *)this->value;
    ptr_4._4_4_ = flatbuffers::FlatBufferBuilderImpl<false>::CreateStruct<BookReader>(_fbb,local_60)
    ;
    this_local._4_4_ =
         flatbuffers::Offset<const_BookReader_*>::Union
                   ((Offset<const_BookReader_*> *)((long)&ptr_4 + 4));
    break;
  case Character_Other:
    local_70 = (string *)this->value;
    ptr_5._4_4_ = flatbuffers::FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>
                            (_fbb,local_70);
    this_local._4_4_ =
         flatbuffers::Offset<flatbuffers::String>::Union
                   ((Offset<flatbuffers::String> *)((long)&ptr_5 + 4));
    break;
  case Character_MAX:
    local_80 = (string *)this->value;
    local_84 = flatbuffers::FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>
                         (_fbb,local_80);
    this_local._4_4_ = flatbuffers::Offset<flatbuffers::String>::Union(&local_84);
    break;
  default:
    flatbuffers::Offset<void>::Offset((Offset<void> *)((long)&this_local + 4),0);
  }
  return (Offset<void>)this_local._4_4_;
}

Assistant:

inline ::flatbuffers::Offset<void> CharacterUnion::Pack(::flatbuffers::FlatBufferBuilder &_fbb, const ::flatbuffers::rehasher_function_t *_rehasher) const {
  (void)_rehasher;
  switch (type) {
    case Character_MuLan: {
      auto ptr = reinterpret_cast<const AttackerT *>(value);
      return CreateAttacker(_fbb, ptr, _rehasher).Union();
    }
    case Character_Rapunzel: {
      auto ptr = reinterpret_cast<const Rapunzel *>(value);
      return _fbb.CreateStruct(*ptr).Union();
    }
    case Character_Belle: {
      auto ptr = reinterpret_cast<const BookReader *>(value);
      return _fbb.CreateStruct(*ptr).Union();
    }
    case Character_BookFan: {
      auto ptr = reinterpret_cast<const BookReader *>(value);
      return _fbb.CreateStruct(*ptr).Union();
    }
    case Character_Other: {
      auto ptr = reinterpret_cast<const std::string *>(value);
      return _fbb.CreateString(*ptr).Union();
    }
    case Character_Unused: {
      auto ptr = reinterpret_cast<const std::string *>(value);
      return _fbb.CreateString(*ptr).Union();
    }
    default: return 0;
  }
}